

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_stdio.c
# Opt level: O1

ALLEGRO_FILE * al_make_temp_file(char *template,ALLEGRO_PATH **ret_path)

{
  char cVar1;
  int iVar2;
  size_t sVar3;
  char *filename;
  ALLEGRO_PATH *path;
  char *pcVar4;
  ALLEGRO_FILE *pAVar5;
  int *piVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  
  sVar3 = strlen(template);
  filename = (char *)al_malloc_with_context
                               (sVar3 + 1,0x1d5,
                                "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/src/file_stdio.c"
                                ,"al_make_temp_file");
  path = al_get_standard_path(1);
  pAVar5 = (ALLEGRO_FILE *)0x0;
  if (path != (ALLEGRO_PATH *)0x0 && filename != (char *)0x0) {
    iVar7 = 0;
    do {
      sVar3 = strlen(template);
      if (sVar3 == 0) {
        uVar9 = 0;
      }
      else {
        uVar8 = 1;
        uVar9 = 0;
        do {
          cVar1 = template[uVar9];
          if (cVar1 == 'X') {
            iVar2 = _al_rand();
            cVar1 = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789"
                    [(ulong)(long)iVar2 % 0x3e];
          }
          filename[uVar9] = cVar1;
          uVar9 = (ulong)uVar8;
          uVar8 = uVar8 + 1;
        } while (uVar9 < sVar3);
      }
      filename[uVar9] = '\0';
      al_set_path_filename(path,filename);
      pcVar4 = al_path_cstr(path,'/');
      iVar2 = open(pcVar4,0xc2,0x1c0);
      if (iVar2 != -1) goto LAB_0015aa26;
      iVar7 = iVar7 + 1;
    } while (iVar7 != 1000);
    iVar2 = -1;
LAB_0015aa26:
    if (iVar2 == -1) {
      piVar6 = __errno_location();
      al_set_errno(*piVar6);
    }
    else {
      pAVar5 = al_fopen_fd(iVar2,"rb+");
      if (pAVar5 != (ALLEGRO_FILE *)0x0) goto LAB_0015aa81;
      piVar6 = __errno_location();
      al_set_errno(*piVar6);
      close(iVar2);
      pcVar4 = al_path_cstr(path,'/');
      unlink(pcVar4);
    }
    pAVar5 = (ALLEGRO_FILE *)0x0;
  }
LAB_0015aa81:
  al_free_with_context
            (filename,0x1dd,
             "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/src/file_stdio.c"
             ,"al_make_temp_file");
  if ((ret_path == (ALLEGRO_PATH **)0x0) || (pAVar5 == (ALLEGRO_FILE *)0x0)) {
    al_destroy_path(path);
  }
  else {
    *ret_path = path;
  }
  return pAVar5;
}

Assistant:

ALLEGRO_FILE *al_make_temp_file(const char *template, ALLEGRO_PATH **ret_path)
{
   char *temp_filename;
   ALLEGRO_PATH *path;
   ALLEGRO_FILE *f;

   temp_filename = al_malloc(strlen(template) + 1);
   path = al_get_standard_path(ALLEGRO_TEMP_PATH);

   if (temp_filename && path)
      f = make_temp_file(template, temp_filename, path);
   else
      f = NULL;

   al_free(temp_filename);

   if (f && ret_path)
      *ret_path = path;
   else
      al_destroy_path(path);

   return f;
}